

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

lua_Integer unpackint(lua_State *L,char *str,int islittle,int size,int issigned)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = 8;
  if (size < 8) {
    uVar8 = size;
  }
  if (size < 1) {
    uVar9 = 0;
  }
  else {
    iVar1 = uVar8 + 1;
    iVar6 = size - uVar8;
    uVar9 = 0;
    do {
      iVar4 = iVar1 + -2;
      if (islittle == 0) {
        iVar4 = iVar6;
      }
      uVar9 = uVar9 << 8 | (ulong)(byte)str[iVar4];
      iVar1 = iVar1 + -1;
      iVar6 = iVar6 + 1;
    } while (1 < iVar1);
  }
  if (size < 8) {
    if (issigned != 0) {
      bVar3 = (char)(size << 3) - 1;
      uVar9 = (uVar9 ^ 1L << ((ulong)bVar3 & 0x3f)) - (1L << (bVar3 & 0x3f));
    }
  }
  else if (size != 8) {
    cVar7 = -1;
    if (-1 < (long)uVar9) {
      cVar7 = '\0';
    }
    if (issigned == 0) {
      cVar7 = '\0';
    }
    uVar5 = ~uVar8 + size;
    do {
      uVar2 = uVar8;
      if (islittle == 0) {
        uVar2 = uVar5;
      }
      if (cVar7 != str[(int)uVar2]) {
        luaL_error(L,"%d-byte integer does not fit into Lua Integer",size);
      }
      uVar8 = uVar8 + 1;
      uVar5 = uVar5 - 1;
    } while ((int)uVar8 < size);
  }
  return uVar9;
}

Assistant:

static lua_Integer unpackint (lua_State *L, const char *str,
                              int islittle, int size, int issigned) {
  lua_Unsigned res = 0;
  int i;
  int limit = (size  <= SZINT) ? size : SZINT;
  for (i = limit - 1; i >= 0; i--) {
    res <<= NB;
    res |= (lua_Unsigned)(unsigned char)str[islittle ? i : size - 1 - i];
  }
  if (size < SZINT) {  /* real size smaller than lua_Integer? */
    if (issigned) {  /* needs sign extension? */
      lua_Unsigned mask = (lua_Unsigned)1 << (size*NB - 1);
      res = ((res ^ mask) - mask);  /* do sign extension */
    }
  }
  else if (size > SZINT) {  /* must check unread bytes */
    int mask = (!issigned || (lua_Integer)res >= 0) ? 0 : MC;
    for (i = limit; i < size; i++) {
      if (l_unlikely((unsigned char)str[islittle ? i : size - 1 - i] != mask))
        luaL_error(L, "%d-byte integer does not fit into Lua Integer", size);
    }
  }
  return (lua_Integer)res;
}